

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HelperFunctions.cpp
# Opt level: O0

vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
* dgrminer::find_maximal_subsets_of_pairs
            (vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
             *__return_storage_ptr__,
            vector<std::set<dgrminer::int_pair,_std::less<dgrminer::int_pair>,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::set<dgrminer::int_pair,_std::less<dgrminer::int_pair>,_std::allocator<dgrminer::int_pair>_>_>_>
            *sets)

{
  pointer pvVar1;
  bool bVar2;
  bool bVar3;
  pointer piVar4;
  reference pvVar5;
  reference __x;
  size_type sVar6;
  iterator iVar7;
  iterator iVar8;
  reference pvVar9;
  pointer pvVar10;
  reference pvVar11;
  ulong uVar12;
  reference pvVar13;
  reference pvVar14;
  int local_198;
  int local_194;
  int d;
  int testIndex;
  undefined1 local_188 [3];
  bool setClear;
  int testMatches;
  vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_> testSet;
  undefined1 local_168 [4];
  int c;
  vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
  testBucket;
  int b;
  bool addSet;
  vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_> currentSet;
  undefined1 local_128 [4];
  int a;
  vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
  currentBucket;
  ulong uStack_108;
  int i_3;
  size_t i_2;
  vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
  newbucked;
  size_t i_1;
  vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
  bucket;
  int length;
  int local_ac;
  _Self local_90;
  _Self local_88;
  iterator j;
  vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_> vec;
  size_t i;
  vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
  vectors;
  vector<std::vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>,_std::allocator<std::vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>_>_>
  buckets;
  vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
  output;
  vector<std::set<dgrminer::int_pair,_std::less<dgrminer::int_pair>,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::set<dgrminer::int_pair,_std::less<dgrminer::int_pair>,_std::allocator<dgrminer::int_pair>_>_>_>
  *sets_local;
  
  std::
  vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
  ::vector((vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
            *)&buckets.
               super__Vector_base<std::vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>,_std::allocator<std::vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>,_std::allocator<std::vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>_>_>
  ::vector((vector<std::vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>,_std::allocator<std::vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>_>_>
            *)&vectors.
               super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
  ::vector((vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
            *)&i);
  for (vec.super__Vector_base<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      piVar4 = (pointer)std::
                        vector<std::set<dgrminer::int_pair,_std::less<dgrminer::int_pair>,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::set<dgrminer::int_pair,_std::less<dgrminer::int_pair>,_std::allocator<dgrminer::int_pair>_>_>_>
                        ::size(sets),
      vec.super__Vector_base<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage < piVar4;
      vec.super__Vector_base<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)((long)&(vec.
                             super__Vector_base<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage)->first + 1)) {
    std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>::vector
              ((vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_> *)&j);
    pvVar5 = std::
             vector<std::set<dgrminer::int_pair,_std::less<dgrminer::int_pair>,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::set<dgrminer::int_pair,_std::less<dgrminer::int_pair>,_std::allocator<dgrminer::int_pair>_>_>_>
             ::operator[](sets,(size_type)
                               vec.
                               super__Vector_base<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
    local_88._M_node =
         (_Base_ptr)
         std::
         set<dgrminer::int_pair,_std::less<dgrminer::int_pair>,_std::allocator<dgrminer::int_pair>_>
         ::begin(pvVar5);
    while( true ) {
      pvVar5 = std::
               vector<std::set<dgrminer::int_pair,_std::less<dgrminer::int_pair>,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::set<dgrminer::int_pair,_std::less<dgrminer::int_pair>,_std::allocator<dgrminer::int_pair>_>_>_>
               ::operator[](sets,(size_type)
                                 vec.
                                 super__Vector_base<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
      local_90._M_node =
           (_Base_ptr)
           std::
           set<dgrminer::int_pair,_std::less<dgrminer::int_pair>,_std::allocator<dgrminer::int_pair>_>
           ::end(pvVar5);
      bVar2 = std::operator!=(&local_88,&local_90);
      if (!bVar2) break;
      __x = std::_Rb_tree_const_iterator<dgrminer::int_pair>::operator*(&local_88);
      std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>::push_back
                ((vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_> *)&j,__x);
      std::_Rb_tree_const_iterator<dgrminer::int_pair>::operator++(&local_88,0);
    }
    std::
    vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
    ::push_back((vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                 *)&i,(value_type *)&j);
    std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>::~vector
              ((vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_> *)&j);
  }
  sVar6 = std::
          vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
          ::size((vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                  *)&i);
  if (sVar6 < 2) {
    std::
    vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
    ::vector(__return_storage_ptr__,
             (vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
              *)&i);
  }
  else {
    iVar7 = std::
            vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
            ::begin((vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                     *)&i);
    iVar8 = std::
            vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
            ::end((vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                   *)&i);
    std::
    sort<__gnu_cxx::__normal_iterator<std::vector<dgrminer::int_pair,std::allocator<dgrminer::int_pair>>*,std::vector<std::vector<dgrminer::int_pair,std::allocator<dgrminer::int_pair>>,std::allocator<std::vector<dgrminer::int_pair,std::allocator<dgrminer::int_pair>>>>>,dgrminer::find_maximal_subsets_of_pairs(std::vector<std::set<dgrminer::int_pair,std::less<dgrminer::int_pair>,std::allocator<dgrminer::int_pair>>,std::allocator<std::set<dgrminer::int_pair,std::less<dgrminer::int_pair>,std::allocator<dgrminer::int_pair>>>>)::__0>
              (iVar7._M_current,iVar8._M_current);
    pvVar9 = std::
             vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
             ::operator[]((vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                           *)&i,0);
    sVar6 = std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>::size(pvVar9);
    bucket.
    super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = (int)sVar6;
    std::
    vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
    ::vector((vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
              *)&i_1);
    for (newbucked.
         super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pvVar1 = newbucked.
                 super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
        pvVar10 = (pointer)std::
                           vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                           ::size((vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                                   *)&i), pvVar1 < pvVar10;
        newbucked.
        super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)((long)&((newbucked.
                                super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                              super__Vector_base<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>
                              )._M_impl.super__Vector_impl_data._M_start + 1)) {
      pvVar9 = std::
               vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
               ::operator[]((vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                             *)&i,(size_type)
                                  newbucked.
                                  super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      sVar6 = std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>::size(pvVar9);
      if (sVar6 == (long)(int)bucket.
                              super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        pvVar9 = std::
                 vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                 ::operator[]((vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                               *)&i,(size_type)
                                    newbucked.
                                    super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::
        vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
        ::push_back((vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                     *)&i_1,pvVar9);
      }
      else {
        pvVar9 = std::
                 vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                 ::operator[]((vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                               *)&i,(size_type)
                                    newbucked.
                                    super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        sVar6 = std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>::size(pvVar9);
        bucket.
        super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = (int)sVar6;
        std::
        vector<std::vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>,_std::allocator<std::vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>_>_>
        ::push_back((vector<std::vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>,_std::allocator<std::vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>_>_>
                     *)&vectors.
                        super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)&i_1);
        std::
        vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
        ::vector((vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                  *)&i_2);
        std::
        vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
        ::operator=((vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                     *)&i_1,(vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                             *)&i_2);
        pvVar9 = std::
                 vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                 ::operator[]((vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                               *)&i,(size_type)
                                    newbucked.
                                    super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::
        vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
        ::push_back((vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                     *)&i_1,pvVar9);
        std::
        vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
        ::~vector((vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                   *)&i_2);
      }
    }
    std::
    vector<std::vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>,_std::allocator<std::vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>_>_>
    ::push_back((vector<std::vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>,_std::allocator<std::vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>_>_>
                 *)&vectors.
                    super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)&i_1);
    uStack_108 = 0;
    while( true ) {
      pvVar11 = std::
                vector<std::vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>,_std::allocator<std::vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>_>_>
                ::operator[]((vector<std::vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>,_std::allocator<std::vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>_>_>
                              *)&vectors.
                                 super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
      sVar6 = std::
              vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
              ::size(pvVar11);
      if (sVar6 <= uStack_108) break;
      pvVar11 = std::
                vector<std::vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>,_std::allocator<std::vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>_>_>
                ::operator[]((vector<std::vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>,_std::allocator<std::vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>_>_>
                              *)&vectors.
                                 super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
      pvVar9 = std::
               vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
               ::operator[](pvVar11,uStack_108);
      std::
      vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
      ::push_back((vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                   *)&buckets.
                      super__Vector_base<std::vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>,_std::allocator<std::vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,pvVar9);
      uStack_108 = uStack_108 + 1;
    }
    for (currentBucket.
         super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
        uVar12 = (ulong)currentBucket.
                        super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
        sVar6 = std::
                vector<std::vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>,_std::allocator<std::vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>_>_>
                ::size((vector<std::vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>,_std::allocator<std::vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>_>_>
                        *)&vectors.
                           super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage), uVar12 < sVar6;
        currentBucket.
        super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
             currentBucket.
             super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
      pvVar11 = std::
                vector<std::vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>,_std::allocator<std::vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>_>_>
                ::operator[]((vector<std::vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>,_std::allocator<std::vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>_>_>
                              *)&vectors.
                                 super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
                             (long)currentBucket.
                                   super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
      std::
      vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
      ::vector((vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                *)local_128,pvVar11);
      for (currentSet.super__Vector_base<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
          uVar12 = (ulong)currentSet.
                          super__Vector_base<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
          sVar6 = std::
                  vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                  ::size((vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                          *)local_128), uVar12 < sVar6;
          currentSet.super__Vector_base<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
               currentSet.
               super__Vector_base<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
        pvVar9 = std::
                 vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                 ::operator[]((vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                               *)local_128,
                              (long)currentSet.
                                    super__Vector_base<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
        std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>::vector
                  ((vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_> *)&b,pvVar9);
        sVar6 = std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>::size
                          ((vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_> *)&b);
        if (sVar6 != 0) {
          testBucket.
          super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
          for (testBucket.
               super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
              (int)testBucket.
                   super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage <
              currentBucket.
              super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
              testBucket.
              super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
                   (int)testBucket.
                        super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) {
            pvVar11 = std::
                      vector<std::vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>,_std::allocator<std::vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>_>_>
                      ::operator[]((vector<std::vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>,_std::allocator<std::vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>_>_>
                                    *)&vectors.
                                       super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                   (long)(int)testBucket.
                                              super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
            std::
            vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
            ::vector((vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                      *)local_168,pvVar11);
            for (testSet.super__Vector_base<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
                uVar12 = (ulong)testSet.
                                super__Vector_base<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                sVar6 = std::
                        vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                        ::size((vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                                *)local_168), uVar12 < sVar6;
                testSet.super__Vector_base<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
                     testSet.
                     super__Vector_base<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
              pvVar9 = std::
                       vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                       ::operator[]((vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                                     *)local_168,
                                    (long)testSet.
                                          super__Vector_base<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
              std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>::vector
                        ((vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_> *)
                         local_188,pvVar9);
              testIndex = 0;
              bVar2 = false;
              local_194 = 0;
              for (local_198 = 0;
                  sVar6 = std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>::size
                                    ((vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>
                                      *)&b), (ulong)(long)local_198 < sVar6;
                  local_198 = local_198 + 1) {
                for (; sVar6 = std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>
                               ::size((vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>
                                       *)local_188), (ulong)(long)local_194 < sVar6;
                    local_194 = local_194 + 1) {
                  pvVar13 = std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>::
                            operator[]((vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>
                                        *)&b,(long)local_198);
                  pvVar14 = std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>::
                            operator[]((vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>
                                        *)local_188,(long)local_194);
                  bVar3 = operator<(pvVar13,pvVar14);
                  if (bVar3) {
                    bVar2 = true;
                    break;
                  }
                  pvVar13 = std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>::
                            operator[]((vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>
                                        *)&b,(long)local_198);
                  pvVar14 = std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>::
                            operator[]((vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>
                                        *)local_188,(long)local_194);
                  bVar3 = operator==(pvVar13,pvVar14);
                  if (bVar3) {
                    testIndex = testIndex + 1;
                    sVar6 = std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>::
                            size((vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_> *)
                                 &b);
                    if ((long)testIndex == sVar6) {
                      testBucket.
                      super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
                      bVar2 = true;
                    }
                    break;
                  }
                }
                if (bVar2) break;
              }
              if ((testBucket.
                   super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
                local_ac = 0x17;
              }
              else {
                local_ac = 0;
              }
              std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>::~vector
                        ((vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_> *)
                         local_188);
              if (local_ac != 0) break;
            }
            if ((testBucket.
                 super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
              local_ac = 0x14;
            }
            else {
              local_ac = 0;
            }
            std::
            vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
            ::~vector((vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                       *)local_168);
            if (local_ac != 0) break;
          }
          if ((testBucket.
               super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) {
            std::
            vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
            ::push_back((vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                         *)&buckets.
                            super__Vector_base<std::vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>,_std::allocator<std::vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)&b);
          }
        }
        std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>::~vector
                  ((vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_> *)&b);
      }
      std::
      vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
      ::~vector((vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                 *)local_128);
    }
    std::
    vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
    ::vector(__return_storage_ptr__,
             (vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
              *)&buckets.
                 super__Vector_base<std::vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>,_std::allocator<std::vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
    ::~vector((vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
               *)&i_1);
  }
  std::
  vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
  ::~vector((vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
             *)&i);
  std::
  vector<std::vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>,_std::allocator<std::vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>_>_>
  ::~vector((vector<std::vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>,_std::allocator<std::vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>_>_>
             *)&vectors.
                super__Vector_base<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
  ::~vector((vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>
             *)&buckets.
                super__Vector_base<std::vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>,_std::allocator<std::vector<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::vector<dgrminer::int_pair,_std::allocator<dgrminer::int_pair>_>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::vector<int_pair>> find_maximal_subsets_of_pairs(std::vector<std::set<int_pair>> sets)
    {
        std::vector<std::vector<int_pair>> output;
        std::vector<std::vector<std::vector<int_pair>>> buckets;

        // transform sets into vectors:
        std::vector<std::vector<int_pair>> vectors;
        for (size_t i = 0; i < sets.size(); i++)
        {
            std::vector<int_pair> vec;
            for (std::set<int_pair>::iterator j = sets[i].begin(); j != sets[i].end(); j++)
            {
                vec.push_back(*j);
            }
            vectors.push_back(vec);
        }


        if (vectors.size() <= 1)
        { return vectors; }

        // sort the vector by descending length
        std::sort(vectors.begin(), vectors.end(),
                  [](std::vector<int_pair> x, std::vector<int_pair> y) -> int { return (x.size() > y.size()); });


        int length = vectors[0].size();
        std::vector<std::vector<int_pair>> bucket;//current bucket
        //Place each set with shared length in its own bucket
        for (size_t i = 0; i < vectors.size(); i++)
        {
            if (vectors[i].size() == length)//current Bucket
            {
                bucket.push_back(vectors[i]);
            }
            else//new Bucket
            {
                length = vectors[i].size();
                buckets.push_back(bucket);
                std::vector<std::vector<int_pair>> newbucked;
                bucket = newbucked;
                bucket.push_back(vectors[i]);
            }
        }
        buckets.push_back(bucket);

        //Based on the assumption of uniqueness, everything in the first bucket is
        //larger than every other set and since it is unique, they are not proper subsets
        for (size_t i = 0; i < buckets[0].size(); i++)
        {
            output.push_back(buckets[0][i]);
        }

        //Iterate through the buckets
        for (int i = 1; i < buckets.size(); i++)
        {
            std::vector<std::vector<int_pair>> currentBucket = buckets[i];

            //Iterate through the sets in the current bucket
            for (int a = 0; a < currentBucket.size(); a++)
            {
                std::vector<int_pair> currentSet = currentBucket[a]; // this set can be potentially added


                // if the current set is empty and we got here, then there is another set which is a superset of this empty set
                if (currentSet.size() == 0)
                { continue; }

                bool addSet = true;

                //Iterate through buckets with greater length
                for (int b = 0; b < i; b++)
                {
                    std::vector<std::vector<int_pair>> testBucket = buckets[b]; // here can be potentially a super set of the currentSet


                    //Iterate through the sets in testBucket
                    for (int c = 0; c < testBucket.size(); c++)
                    {
                        std::vector<int_pair> testSet = testBucket[c]; // this can be potentially a super set of the currentSet
                        int testMatches = 0;

                        bool setClear = false; // my addition
                        int testIndex = 0;
                        //Iterate through the values in the current set
                        for (int d = 0; d < currentSet.size(); d++)
                        {

                            //Iterate through the values in the test set
                            for (; testIndex < testSet.size(); testIndex++)
                            {
                                if (currentSet[d] < testSet[testIndex])
                                {
                                    setClear = true;
                                    break;
                                }
                                if (currentSet[d] == testSet[testIndex])
                                {
                                    testMatches++;
                                    if (testMatches == currentSet.size())
                                    {
                                        // SAME LENGTH
                                        addSet = false;
                                        setClear = true;
                                    }
                                    break;
                                }
                            }//testIndex
                            if (setClear)
                            { break; }
                        }//d
                        if (!addSet)
                        { break; }
                    }//c
                    if (!addSet)
                    { break; }
                }//b
                if (addSet)
                { output.push_back(currentSet); }
            }//a
        }//i


        return output;
    }